

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  this->depth = 0;
  this->width = 0;
  this->height = 0;
  this->n = 0;
  this->pixel = (unsigned_short *)0x0;
  this->row = (unsigned_short **)0x0;
  this->img = (unsigned_short ***)0x0;
  setSize(this,a->width,a->height,(long)a->depth);
  memcpy(this->pixel,a->pixel,this->n * 2);
  return;
}

Assistant:

Image(const Image<T> &a)
    {
      depth=0;
      width=0;
      height=0;
      n=0;
      pixel=0;
      row=0;
      img=0;

      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, n*sizeof(T));
    }